

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O1

void update_cb(pfx_table *p,pfx_record rec,_Bool added)

{
  rtr_socket *prVar1;
  char *__format;
  long in_FS_OFFSET;
  undefined1 local_58 [56];
  long local_20;
  
  prVar1 = rec.socket;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((print_all_pfx_updates) || (*(char *)((long)&rec.socket[1].pfx_table + 4) == '\x01')) {
    pthread_mutex_lock((pthread_mutex_t *)&stdout_mutex);
    __format = "- ";
    if (added) {
      __format = "+ ";
    }
    printf(__format);
    lrtr_ip_addr_to_str(&rec.prefix,local_58,0x2e);
    if (socket_count < 2) {
      printf("%-40s   %3u - %3u   %10u\n",local_58,(ulong)rec.min_len,(ulong)rec.max_len,
             (ulong)rec.asn);
    }
    else {
      printf("%s:%s %-40s   %3u - %3u   %10u\n",prVar1[1].connection_state_fp,
             prVar1[1].connection_state_fp_param_config,local_58,(ulong)rec.min_len,
             (ulong)rec.max_len,rec.asn);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&stdout_mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void update_cb(struct pfx_table *p __attribute__((unused)), const struct pfx_record rec, const bool added)
{
	char ip[INET6_ADDRSTRLEN];

	const struct socket_config *config = (const struct socket_config *)rec.socket;

	if (!print_all_pfx_updates && !config->print_pfx_updates)
		return;

	pthread_mutex_lock(&stdout_mutex);
	if (added)
		printf("+ ");
	else
		printf("- ");
	lrtr_ip_addr_to_str(&rec.prefix, ip, sizeof(ip));
	if (socket_count > 1)
		printf("%s:%s %-40s   %3u - %3u   %10u\n", config->host, config->port, ip, rec.min_len, rec.max_len,
		       rec.asn);
	else
		printf("%-40s   %3u - %3u   %10u\n", ip, rec.min_len, rec.max_len, rec.asn);

	pthread_mutex_unlock(&stdout_mutex);
}